

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * strscpy(char *dest,char *src,size_t size)

{
  if (size != 0 && (src != (char *)0x0 && dest != (char *)0x0)) {
    strncpy(dest,src,size - 1);
    dest[size - 1] = '\0';
  }
  return dest;
}

Assistant:

char *
strscpy(char *dest, const char *src, size_t size) {
  if (dest == NULL || src == NULL || size == 0) {
    return dest;
  }

  /* src does not need to be null terminated */
  strncpy(dest, src, size - 1);
  dest[size - 1] = 0;

  return dest;
}